

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall wasm::TypeUpdater::maybeUpdateTypeToUnreachable(TypeUpdater *this,Block *curr)

{
  bool bVar1;
  mapped_type *pmVar2;
  Block *curr_local;
  TypeUpdater *this_local;
  
  bVar1 = wasm::Type::isConcrete
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type);
  if ((bVar1) &&
     ((bVar1 = IString::is(&(curr->name).super_IString), !bVar1 ||
      (pmVar2 = std::
                map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
                ::operator[](&this->blockInfos,&curr->name), pmVar2->numBreaks < 1)))) {
    makeBlockUnreachableIfNoFallThrough(this,curr);
  }
  return;
}

Assistant:

void maybeUpdateTypeToUnreachable(Block* curr) {
    if (!curr->type.isConcrete()) {
      return; // nothing concrete to change to unreachable
    }
    if (curr->name.is() && blockInfos[curr->name].numBreaks > 0) {
      return; // has a break, not unreachable
    }
    // look for a fallthrough
    makeBlockUnreachableIfNoFallThrough(curr);
  }